

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadapi_pthreads.c
# Opt level: O1

THREADAPI_RESULT ThreadAPI_Create(THREAD_HANDLE *threadHandle,THREAD_START_FUNC func,void *arg)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  pthread_t *__newthread;
  THREADAPI_RESULT TVar3;
  char *pcVar4;
  undefined8 uVar5;
  
  if (threadHandle == (THREAD_HANDLE *)0x0 || func == (THREAD_START_FUNC)0x0) {
    p_Var2 = xlogging_get_log_function();
    TVar3 = THREADAPI_INVALID_ARG;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return THREADAPI_INVALID_ARG;
    }
    iVar1 = 0x2f;
    uVar5 = 2;
    pcVar4 = THREADAPI_RESULTStringStorage[2];
  }
  else {
    __newthread = (pthread_t *)malloc(0x18);
    if (__newthread == (pthread_t *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return THREADAPI_NO_MEMORY;
      }
      iVar1 = 0x37;
    }
    else {
      __newthread[1] = (pthread_t)func;
      __newthread[2] = (pthread_t)arg;
      iVar1 = pthread_create(__newthread,(pthread_attr_t *)0x0,ThreadWrapper,__newthread);
      if (iVar1 == 0) {
        *threadHandle = __newthread;
        return THREADAPI_OK;
      }
      if (iVar1 != 0xb) {
        free(__newthread);
        p_Var2 = xlogging_get_log_function();
        TVar3 = THREADAPI_ERROR;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return THREADAPI_ERROR;
        }
        iVar1 = 0x44;
        uVar5 = 4;
        pcVar4 = THREADAPI_RESULTStringStorage[4];
        goto LAB_00116b81;
      }
      free(__newthread);
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return THREADAPI_NO_MEMORY;
      }
      iVar1 = 0x50;
    }
    TVar3 = THREADAPI_NO_MEMORY;
    uVar5 = 3;
    pcVar4 = THREADAPI_RESULTStringStorage[3];
  }
LAB_00116b81:
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/threadapi_pthreads.c"
            ,"ThreadAPI_Create",iVar1,1,"(result = %s%s (%d))","",pcVar4,uVar5);
  return TVar3;
}

Assistant:

THREADAPI_RESULT ThreadAPI_Create(THREAD_HANDLE* threadHandle, THREAD_START_FUNC func, void* arg)
{
    THREADAPI_RESULT result;

    if ((threadHandle == NULL) ||
        (func == NULL))
    {
        result = THREADAPI_INVALID_ARG;
        LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
    }
    else
    {
        THREAD_INSTANCE* threadInstance = malloc(sizeof(THREAD_INSTANCE));
        if (threadInstance == NULL)
        {
            result = THREADAPI_NO_MEMORY;
            LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
        }
        else
        {
            threadInstance->ThreadStartFunc = func;
            threadInstance->Arg = arg;
            int createResult = pthread_create(&threadInstance->Pthread_handle, NULL, ThreadWrapper, threadInstance);
            switch (createResult)
            {
            default:
                free(threadInstance);

                result = THREADAPI_ERROR;
                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
                break;

            case 0:
                *threadHandle = threadInstance;
                result = THREADAPI_OK;
                break;

            case EAGAIN:
                free(threadInstance);

                result = THREADAPI_NO_MEMORY;
                LogError("(result = %" PRI_MU_ENUM ")", MU_ENUM_VALUE(THREADAPI_RESULT, result));
                break;
            }
        }
    }

    return result;
}